

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

Bit32u __thiscall MT32Emu::Synth::getPartStates(Synth *this)

{
  uint uVar1;
  Bit32u BVar2;
  int partNumber;
  long lVar3;
  bool partStates [9];
  byte abStack_1a [10];
  
  BVar2 = 0;
  if (this->opened == true) {
    lVar3 = 0;
    do {
      uVar1 = Part::getActiveNonReleasingPartialCount(this->parts[lVar3]);
      abStack_1a[lVar3 + 1] = uVar1 != 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 9);
    BVar2 = 0;
    lVar3 = 9;
    do {
      BVar2 = (uint)abStack_1a[lVar3] + BVar2 * 2;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return BVar2;
}

Assistant:

Bit32u Synth::getPartStates() const {
	if (!opened) return 0;
	bool partStates[9];
	getPartStates(partStates);
	Bit32u bitSet = 0;
	for (int partNumber = 8; partNumber >= 0; partNumber--) {
		bitSet = (bitSet << 1) | (partStates[partNumber] ? 1 : 0);
	}
	return bitSet;
}